

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3SegReaderSort(Fts3SegReader **apSegment,int nSegment,int nSuspect,
                      _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  undefined1 (*pauVar4) [16];
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  
  iVar3 = nSuspect - (uint)(nSuspect == nSegment);
  uVar5 = ~(uint)(nSuspect == nSegment) + nSuspect;
  do {
    if (iVar3 < 1) {
      return;
    }
    pauVar4 = (undefined1 (*) [16])(apSegment + uVar5);
    iVar3 = iVar3 + -1;
    for (uVar6 = uVar5; (int)uVar6 < nSegment + -1; uVar6 = uVar6 + 1) {
      iVar2 = (*xCmp)(*(Fts3SegReader **)*pauVar4,*(Fts3SegReader **)(*pauVar4 + 8));
      if (iVar2 < 0) break;
      auVar1 = *pauVar4;
      auVar7._0_8_ = auVar1._8_8_;
      auVar7._8_4_ = auVar1._0_4_;
      auVar7._12_4_ = auVar1._4_4_;
      *pauVar4 = auVar7;
      pauVar4 = (undefined1 (*) [16])(*pauVar4 + 8);
    }
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

static void fts3SegReaderSort(
  Fts3SegReader **apSegment,                     /* Array to sort entries of */
  int nSegment,                                  /* Size of apSegment array */
  int nSuspect,                                  /* Unsorted entry count */
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *)  /* Comparison function */
){
  int i;                          /* Iterator variable */

  assert( nSuspect<=nSegment );

  if( nSuspect==nSegment ) nSuspect--;
  for(i=nSuspect-1; i>=0; i--){
    int j;
    for(j=i; j<(nSegment-1); j++){
      Fts3SegReader *pTmp;
      if( xCmp(apSegment[j], apSegment[j+1])<0 ) break;
      pTmp = apSegment[j+1];
      apSegment[j+1] = apSegment[j];
      apSegment[j] = pTmp;
    }
  }

#ifndef NDEBUG
  /* Check that the list really is sorted now. */
  for(i=0; i<(nSuspect-1); i++){
    assert( xCmp(apSegment[i], apSegment[i+1])<0 );
  }
#endif
}